

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_del_elem(node_data *data,uint index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined3 uVar7;
  rtr_socket *prVar8;
  undefined8 uVar9;
  int iVar10;
  data_elem *pdVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long in_FS_OFFSET;
  data_elem deleted_elem;
  undefined4 uVar6;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = (ulong)index;
  pdVar11 = data->ary + uVar12;
  uVar4 = pdVar11->asn;
  uVar5 = pdVar11->max_len;
  uVar7 = *(undefined3 *)&pdVar11->field_0x5;
  uVar6 = CONCAT31(uVar7,uVar5);
  prVar8 = pdVar11->socket;
  uVar13 = data->len;
  lVar14 = uVar12 * 0x10;
  if (uVar13 - 1 != index) {
    for (; uVar12 < uVar13 - 1; uVar12 = uVar12 + 1) {
      puVar1 = (undefined8 *)((long)&data->ary[1].asn + lVar14);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&data->ary->asn + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      uVar13 = data->len;
      lVar14 = lVar14 + 0x10;
    }
  }
  uVar13 = uVar13 - 1;
  data->len = uVar13;
  if (uVar13 == 0) {
    lrtr_free(data->ary);
    data->ary = (data_elem *)0x0;
  }
  else {
    pdVar11 = (data_elem *)lrtr_realloc(data->ary,(ulong)uVar13 << 4);
    if (pdVar11 == (data_elem *)0x0) {
      deleted_elem.socket._0_4_ = SUB84(prVar8,0);
      deleted_elem.socket._4_4_ = (undefined4)((ulong)prVar8 >> 0x20);
      pdVar11 = data->ary + data->len;
      pdVar11->asn = uVar4;
      *(undefined4 *)&pdVar11->max_len = uVar6;
      *(undefined4 *)&pdVar11->socket = deleted_elem.socket._0_4_;
      *(undefined4 *)((long)&pdVar11->socket + 4) = deleted_elem.socket._4_4_;
      data->len = data->len + 1;
      iVar10 = -1;
      goto LAB_001076f0;
    }
    data->ary = pdVar11;
  }
  iVar10 = 0;
LAB_001076f0:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return iVar10;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_del_elem(struct node_data *data, const unsigned int index)
{
	struct data_elem *tmp;
	struct data_elem deleted_elem = data->ary[index];

	// if index is not the last elem in the list, move all other elems backwards in the array
	if (index != data->len - 1) {
		for (unsigned int i = index; i < data->len - 1; i++)
			data->ary[i] = data->ary[i + 1];
	}

	data->len--;
	if (!data->len) {
		lrtr_free(data->ary);
		data->ary = NULL;
		return PFX_SUCCESS;
	}

	tmp = lrtr_realloc(data->ary, sizeof(struct data_elem) * data->len);
	if (!tmp) {
		data->ary[data->len] = deleted_elem;
		data->len++;
		return PFX_ERROR;
	}

	data->ary = tmp;

	return PFX_SUCCESS;
}